

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::Function::rebuildBlockPredecessors(Function *this)

{
  pointer ppVar1;
  Block *pBVar2;
  pointer ppVar3;
  pool_ref<soul::heart::Block> *ppVar4;
  Terminator *pTVar5;
  long lVar6;
  iterator __position;
  int iVar7;
  pool_ref<soul::heart::Block> *b;
  pointer ppVar8;
  undefined4 extraout_var;
  long *extraout_RDX;
  pool_ref<soul::heart::Block> *b_1;
  pool_ref<soul::heart::Block> *__args;
  long *plVar9;
  
  ppVar1 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (this->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1; ppVar8 = ppVar8 + 1) {
    pBVar2 = ppVar8->object;
    ppVar3 = (pBVar2->predecessors).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar2->predecessors).
        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
      (pBVar2->predecessors).
      super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    }
  }
  ppVar4 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != ppVar4; __args = __args + 1) {
    pTVar5 = (__args->object->terminator).object;
    if (pTVar5 != (Terminator *)0x0) {
      iVar7 = (*(pTVar5->super_Object)._vptr_Object[2])();
      for (plVar9 = (long *)CONCAT44(extraout_var,iVar7); plVar9 != extraout_RDX;
          plVar9 = plVar9 + 1) {
        lVar6 = *plVar9;
        __position._M_current = *(pool_ref<soul::heart::Block> **)(lVar6 + 0x50);
        if (__position._M_current == *(pool_ref<soul::heart::Block> **)(lVar6 + 0x58)) {
          std::
          vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
          ::_M_realloc_insert<soul::pool_ref<soul::heart::Block>const&>
                    ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
                      *)(lVar6 + 0x48),__position,__args);
        }
        else {
          (__position._M_current)->object = __args->object;
          *(long *)(lVar6 + 0x50) = *(long *)(lVar6 + 0x50) + 8;
        }
      }
    }
  }
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn)
        {
            for (auto p : parameters)
                p->visitExpressions (fn, AccessType::read);

            for (auto s : statements)
                s->visitExpressions (fn);

            if (terminator != nullptr)
                terminator->visitExpressions (fn);
        }